

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O0

size_t asmjit::v1_14::VirtMem::detectLargePageSize(void)

{
  Error EVar1;
  uint32_t digit;
  size_t i;
  size_t bufSize;
  char *buf;
  size_t largePageSize;
  StringTmp<128UL> storage;
  StringTmp<128UL> *in_stack_fffffffffffffe88;
  ulong local_168;
  size_t in_stack_fffffffffffffea8;
  String *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  ulong uVar2;
  ulong local_128;
  ulong local_110;
  StringTmp<128UL> local_100;
  undefined1 auStack_ff [7];
  ulong local_f8;
  undefined1 *local_e8;
  size_t local_58;
  StringTmp<128UL> *local_50;
  StringTmp<128UL> *local_48;
  StringTmp<128UL> *local_40;
  StringTmp<128UL> *local_38;
  StringTmp<128UL> *local_30;
  StringTmp<128UL> *local_28;
  StringTmp<128UL> *local_20;
  StringTmp<128UL> *local_18;
  StringTmp<128UL> *local_10;
  ulong local_8;
  
  local_50 = &local_100;
  local_48 = &local_100;
  memset(&local_100,0,0x20);
  StringTmp<128UL>::_resetToTemporary(&local_100);
  EVar1 = OSUtils::readFile(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                            in_stack_fffffffffffffea8);
  if (EVar1 == 0) {
    local_30 = &local_100;
    uVar2 = local_f8;
    if ((byte)local_100 < 0x1f) {
      uVar2 = (ulong)(byte)local_100;
    }
    local_28 = local_30;
    local_20 = local_30;
    if (uVar2 != 0) {
      local_110 = 0;
      local_40 = &local_100;
      if ((byte)local_100 < 0x1f) {
        local_e8 = auStack_ff;
      }
      local_18 = &local_100;
      if ((byte)local_100 < 0x1f) {
        local_168 = (ulong)(byte)local_100;
      }
      else {
        local_168 = local_f8;
      }
      local_128 = 0;
      while ((local_128 < local_168 && ((byte)local_e8[local_128] - 0x30 < 10))) {
        local_110 = local_110 * 10 + (ulong)((byte)local_e8[local_128] - 0x30);
        local_128 = local_128 + 1;
      }
      local_8 = local_110;
      local_38 = local_40;
      local_10 = local_18;
      if (local_110 == 0 || (local_110 & local_110 - 1) != 0) {
        local_58 = 0;
      }
      else {
        local_58 = local_110;
      }
      goto LAB_001698ed;
    }
  }
  local_58 = 0;
LAB_001698ed:
  StringTmp<128UL>::~StringTmp(in_stack_fffffffffffffe88);
  return local_58;
}

Assistant:

static size_t detectLargePageSize() noexcept {
#if defined(__APPLE__) && defined(VM_FLAGS_SUPERPAGE_SIZE_2MB) && ASMJIT_ARCH_X86
  return 2u * 1024u * 1024u;
#elif defined(__FreeBSD__)
  Support::Array<size_t, 2> pageSize;
  // TODO: Does it return unsigned?
  return (getpagesizes(pageSize.data(), 2) < 2) ? 0 : uint32_t(pageSize[1]);
#elif defined(__linux__)
  StringTmp<128> storage;
  if (OSUtils::readFile("/sys/kernel/mm/transparent_hugepage/hpage_pmd_size", storage, 16) != kErrorOk || storage.empty())
    return 0u;

  // The first value should be the size of the page (hpage_pmd_size).
  size_t largePageSize = 0;

  const char* buf = storage.data();
  size_t bufSize = storage.size();

  for (size_t i = 0; i < bufSize; i++) {
    uint32_t digit = uint32_t(uint8_t(buf[i]) - uint8_t('0'));
    if (digit >= 10u)
      break;
    largePageSize = largePageSize * 10 + digit;
  }

  if (Support::isPowerOf2(largePageSize))
    return largePageSize;
  else
    return 0u;
#else
  return 0u;
#endif
}